

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleJitProfilingHelpers.cpp
# Opt level: O0

void Js::SimpleJitHelpers::StoreArraySegHelper(Var arr,uint32 index,Var value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SparseArraySegment<void_*> *segment;
  Var value_local;
  uint32 index_local;
  Var arr_local;
  
  if (*arr != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SimpleJitProfilingHelpers.cpp"
                                ,0xbc,"(segment->left == 0)","segment->left == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (*(uint *)((long)arr + 4) <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SimpleJitProfilingHelpers.cpp"
                                ,0xbd,"(index < segment->length)","index < segment->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Memory::WriteBarrierPtr<void>::operator=
            ((WriteBarrierPtr<void> *)((long)arr + (ulong)index * 8 + 0x18),value);
  return;
}

Assistant:

void SimpleJitHelpers::StoreArraySegHelper(Var arr, uint32 index, Var value)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(SimpleStoreArraySegHelper);
        //Adapted from InterpreterStackFrame::OP_SetArraySegmentItem_CI4
        SparseArraySegment<Var> * segment = (SparseArraySegment<Var> *)arr;

        Assert(segment->left == 0);
        Assert(index < segment->length);

        segment->elements[index] = value;
        JIT_HELPER_END(SimpleStoreArraySegHelper);
    }